

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void bitmanip::anon_unknown_0::runTest(Test *test)

{
  char *__s2;
  SourceLocation loc;
  SourceLocation loc_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  allocator<char> local_a1;
  char *local_a0;
  char *pcStack_98;
  unsigned_long local_90;
  char *local_88;
  char *pcStack_80;
  unsigned_long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __s2 = test->category;
  iVar2 = strcmp(*(char **)(in_FS_OFFSET + -8),__s2);
  if (iVar2 != 0) {
    *(char **)(in_FS_OFFSET + -8) = __s2;
    if (detail::logLevel < 4) goto LAB_00104f50;
    local_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/main.cpp";
    pcStack_80 = "runTest";
    local_78 = 0x14;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s2,&local_a1);
    std::operator+(&local_50,"Category: \"",&local_70);
    std::operator+(&local_30,&local_50,"\" tests");
    loc.function = pcStack_80;
    loc.file = local_88;
    loc.line = local_78;
    detail::vlog<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (IMPORTANT,loc,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (4 < detail::logLevel) {
    local_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/main.cpp";
    pcStack_98 = "runTest";
    local_90 = 0x16;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,test->name,&local_a1);
    std::operator+(&local_50,"Running \"",&local_70);
    std::operator+(&local_30,&local_50,"\" ...");
    loc_00.function = pcStack_98;
    loc_00.file = local_a0;
    loc_00.line = local_90;
    detail::vlog<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (INFO,loc_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
LAB_00104f50:
  bVar1 = Test::operator()(test);
  (anonymous_namespace)::testFailureCount = (anonymous_namespace)::testFailureCount + (uint)!bVar1;
  return;
}

Assistant:

void runTest(const Test &test) noexcept
{
    static thread_local const char *previousCategory = "";

    if (std::strcmp(previousCategory, test.category) != 0) {
        previousCategory = test.category;
        BITMANIP_LOG(IMPORTANT, "Category: \"" + std::string{test.category} + "\" tests");
    }
    BITMANIP_LOG(INFO, "Running \"" + std::string{test.name} + "\" ...");
    testFailureCount += not test.operator()();
}